

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::Instance::CallInitFunc
          (Instance *this,Store *store,Ref func_ref,Value *result,Ptr *out_trap)

{
  u64 uVar1;
  Func *pFVar2;
  int iVar3;
  Enum EVar4;
  Ptr func;
  Values results;
  Thread thread;
  RefPtr<wabt::interp::Func> local_118;
  Value *local_100;
  u64 *local_f8;
  long lStack_f0;
  long local_e8;
  void *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  Thread local_b8;
  
  local_f8 = (u64 *)0x0;
  lStack_f0 = 0;
  local_e8 = 0;
  local_100 = result;
  RefPtr<wabt::interp::Func>::RefPtr(&local_118,store,func_ref);
  pFVar2 = local_118.obj_;
  local_c8 = 0;
  local_d8 = (void *)0x0;
  uStack_d0 = 0;
  Thread::Thread(&local_b8,store,(Stream *)0x0);
  iVar3 = (*(pFVar2->super_Extern).super_Object._vptr_Object[5])
                    (pFVar2,&local_b8,&local_d8,&local_f8,out_trap);
  Thread::~Thread(&local_b8);
  if (local_d8 != (void *)0x0) {
    operator_delete(local_d8,local_c8 - (long)local_d8);
  }
  EVar4 = Error;
  if (iVar3 != 1) {
    if (lStack_f0 - (long)local_f8 != 0x10) {
      __assert_fail("results.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                    ,0x2aa,
                    "Result wabt::interp::Instance::CallInitFunc(Store &, const Ref, Value *, Trap::Ptr *)"
                   );
    }
    uVar1 = local_f8[1];
    (local_100->field_0).i64_ = *local_f8;
    *(u64 *)((long)&local_100->field_0 + 8) = uVar1;
    EVar4 = Ok;
  }
  if (local_118.obj_ != (Func *)0x0) {
    Store::DeleteRoot(local_118.store_,local_118.root_index_);
    local_118.obj_ = (Func *)0x0;
    local_118.store_ = (Store *)0x0;
    local_118.root_index_ = 0;
  }
  if (local_f8 != (u64 *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  return (Result)EVar4;
}

Assistant:

Result Instance::CallInitFunc(Store& store,
                              const Ref func_ref,
                              Value* result,
                              Trap::Ptr* out_trap) {
  Values results;
  Func::Ptr func{store, func_ref};
  if (Failed(func->Call(store, {}, results, out_trap))) {
    return Result::Error;
  }
  assert(results.size() == 1);
  *result = results[0];
  return Result::Ok;
}